

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecRe.c
# Opt level: O2

void Ree_ManCutMerge(Gia_Man_t *p,int iObj,int *pList0,int *pList1,Vec_Int_t *vCuts,
                    Hash_IntMan_t *pHash,Vec_Int_t *vData,Vec_Int_t *vXors)

{
  uint *puVar1;
  uint *puVar2;
  uint uVar3;
  int iVar4;
  int iData1;
  uint uVar5;
  uint uVar6;
  undefined4 extraout_EAX;
  int iVar7;
  int iVar8;
  ulong uVar9;
  uint *puVar10;
  Gia_Obj_t *pGVar11;
  int *piVar12;
  int iVar13;
  int iVar14;
  long lVar15;
  uint *pCut0;
  ulong uVar16;
  long lVar17;
  uint uVar18;
  char *__assertion;
  int iVar19;
  undefined1 auVar20 [16];
  int local_a8;
  int local_a0;
  int pCut [6];
  
  Vec_IntFill(vCuts,2,1);
  Vec_IntPush(vCuts,iObj);
  Vec_IntPush(vCuts,0xaa);
  piVar12 = pList0 + 1;
  iVar13 = 0;
  local_a8 = -1;
  local_a0 = -1;
  do {
    if (*pList0 <= iVar13) {
      if ((vXors != (Vec_Int_t *)0x0) && ((0 < local_a0 || (local_a0 = local_a8, 0 < local_a8)))) {
        piVar12 = Vec_IntEntryP(vCuts,local_a0);
        Vec_IntPush(vXors,iObj);
        for (lVar15 = 1; lVar15 <= *piVar12; lVar15 = lVar15 + 1) {
          Vec_IntPush(vXors,piVar12[lVar15]);
        }
        if (*piVar12 == 2) {
          Vec_IntPush(vXors,0);
          return;
        }
      }
      return;
    }
    pCut0 = (uint *)(pList1 + 1);
    for (iVar19 = 0; iVar19 < *pList1; iVar19 = iVar19 + 1) {
      uVar3 = *pCut0;
      uVar5 = 0xffffffff;
      if (-1 < (int)uVar3) {
        uVar5 = uVar3;
      }
      for (lVar15 = 0; (long)(int)uVar5 + 1 != lVar15; lVar15 = lVar15 + 1) {
        pCut[lVar15] = pCut0[lVar15];
      }
      iVar8 = *piVar12;
      uVar9 = (ulong)uVar3;
      if ((int)uVar3 < 1) {
        uVar9 = 0;
      }
      for (lVar15 = 1; iVar4 = pCut[1], lVar15 <= iVar8; lVar15 = lVar15 + 1) {
        uVar16 = 0;
        do {
          if (uVar9 == uVar16) {
            lVar17 = (long)pCut[0];
            if (lVar17 == 3) goto LAB_00535988;
            pCut[0] = pCut[0] + 1;
            pCut[lVar17 + 1] = piVar12[lVar15];
            break;
          }
          lVar17 = uVar16 + 1;
          uVar16 = uVar16 + 1;
        } while (piVar12[lVar15] != pCut0[lVar17]);
      }
      if ((pCut[0] & 0xfffffffeU) != 2) {
        __assertion = "pCut[0] == 2 || pCut[0] == 3";
        uVar3 = 0x70;
LAB_00535a91:
        __assert_fail(__assertion,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecRe.c"
                      ,uVar3,"int Ree_ManCutMergeOne(int *, int *, int *)");
      }
      if (pCut[2] < pCut[1]) {
        pCut[1] = pCut[2];
        pCut[2] = iVar4;
      }
      iVar4 = pCut[2];
      iVar8 = pCut[1];
      if (pCut[2] <= pCut[1]) {
        __assertion = "pCut[1] < pCut[2]";
        uVar3 = 0x73;
        goto LAB_00535a91;
      }
      if (pCut[0] != 2) {
        if (pCut[3] < pCut[2]) {
          pCut[2] = pCut[3];
          pCut[3] = iVar4;
        }
        if (pCut[2] < pCut[1]) {
          pCut[1] = pCut[2];
          pCut[2] = iVar8;
        }
        if (pCut[2] <= pCut[1]) {
          __assertion = "pCut[1] < pCut[2]";
          uVar3 = 0x7a;
          goto LAB_00535a91;
        }
        if (pCut[3] <= pCut[2]) {
          __assertion = "pCut[2] < pCut[3]";
          uVar3 = 0x7b;
          goto LAB_00535a91;
        }
      }
      iData1 = pCut[2];
      iVar4 = pCut[1];
      iVar8 = *vCuts->pArray;
      puVar10 = (uint *)(vCuts->pArray + 1);
      iVar14 = 0;
      if (iVar8 < 1) {
        iVar8 = iVar14;
      }
      for (; iVar14 != iVar8; iVar14 = iVar14 + 1) {
        uVar3 = *puVar10;
        uVar5 = 0xffffffff;
        if (-1 < (int)uVar3) {
          uVar5 = uVar3;
        }
        lVar15 = 0;
        do {
          if ((long)(int)uVar5 + 1 == lVar15) goto LAB_00535988;
          puVar1 = puVar10 + lVar15;
          puVar2 = (uint *)(pCut + lVar15);
          lVar15 = lVar15 + 1;
        } while (*puVar1 == *puVar2);
        puVar10 = puVar10 + (long)(int)uVar3 + 2;
      }
      pGVar11 = Gia_ManObj(p,iObj);
      uVar5 = Ree_ManCutTruthOne(piVar12,pCut);
      uVar6 = Ree_ManCutTruthOne((int *)pCut0,pCut);
      lVar15 = *(long *)pGVar11;
      uVar3 = (uint)lVar15;
      uVar5 = (int)(uVar3 * 4) >> 0x1f ^ uVar5;
      uVar6 = (uint)(lVar15 * 4 >> 0x3f) ^ uVar6;
      if ((int)uVar3 < 0 || (~uVar3 & 0x1fffffff) == 0) {
        uVar18 = uVar5 & uVar6;
      }
      else {
        uVar18 = uVar5 & uVar6;
        if ((uVar3 & 0x1fffffff) < ((uint)((ulong)lVar15 >> 0x20) & 0x1fffffff)) {
          uVar18 = uVar5 ^ uVar6;
        }
      }
      uVar5 = uVar18 & 0xff;
      uVar3 = uVar5 ^ 0xff;
      if (uVar5 < 0x80) {
        uVar3 = uVar5;
      }
      if ((uVar3 == 0x66) && (local_a0 == -1)) {
        local_a0 = vCuts->nSize;
      }
      else if ((uVar3 == 0x69) && (local_a8 == -1)) {
        local_a8 = vCuts->nSize;
      }
      Vec_IntAddToEntry(vCuts,0,uVar6);
      iVar8 = pCut[0];
      lVar17 = (long)pCut[0];
      for (lVar15 = 0; lVar15 <= lVar17; lVar15 = lVar15 + 1) {
        Vec_IntPush(vCuts,pCut[lVar15]);
      }
      Vec_IntPush(vCuts,uVar18 & 0xff);
      auVar20._0_4_ = -(uint)(uVar3 == 0x11);
      auVar20._4_4_ = -(uint)(uVar3 == 0x22);
      auVar20._8_4_ = -(uint)(uVar3 == 0x44);
      auVar20._12_4_ = -(uint)(uVar3 == 0x77);
      iVar7 = movmskps(extraout_EAX,auVar20);
      iVar14 = 0;
      if (iVar7 == 0 && uVar3 != 0x66 || iVar8 != 2) {
        if ((((uVar3 - 0x17 < 0x37) &&
             ((0x40000000100001U >> ((ulong)(uVar3 - 0x17) & 0x3f) & 1) != 0)) || (uVar3 == 0x71))
           || (uVar3 == 0x69)) {
          iVar14 = pCut[3];
          if (iVar8 != 3) {
            __assert_fail("pCut[0] == 3",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecRe.c"
                          ,0x127,
                          "void Ree_ManCutMerge(Gia_Man_t *, int, int *, int *, Vec_Int_t *, Hash_IntMan_t *, Vec_Int_t *, Vec_Int_t *)"
                         );
          }
          goto LAB_00535953;
        }
      }
      else {
LAB_00535953:
        iVar8 = Hsh_Int3ManInsert(pHash,iVar4,iData1,iVar14);
        Vec_IntPushThree(vData,iObj,iVar8,uVar18 & 0xff);
      }
LAB_00535988:
      pCut0 = pCut0 + (long)(int)*pCut0 + 2;
    }
    iVar13 = iVar13 + 1;
    piVar12 = piVar12 + (long)*piVar12 + 2;
  } while( true );
}

Assistant:

void Ree_ManCutMerge( Gia_Man_t * p, int iObj, int * pList0, int * pList1, Vec_Int_t * vCuts, Hash_IntMan_t * pHash, Vec_Int_t * vData, Vec_Int_t * vXors )
{
    int fVerbose = 0;
    int i, k, c, Value, Truth, TruthC, * pCut0, * pCut1, pCut[6], Count = 0;
    int iXor2 = -1, iXor3 = -1;
    if ( fVerbose )
        printf( "Object %d\n", iObj );
    Vec_IntFill( vCuts, 2, 1 );
    Vec_IntPush( vCuts, iObj );
    Vec_IntPush( vCuts, 0xAA );
    Ree_ForEachCut( pList0, pCut0, i )
    Ree_ForEachCut( pList1, pCut1, k )
    {
        if ( !Ree_ManCutMergeOne(pCut0, pCut1, pCut) )
            continue;
        if ( Ree_ManCutCheckEqual(vCuts, pCut) )
            continue;
        Truth = TruthC = Ree_ManCutTruth(Gia_ManObj(p, iObj), pCut0, pCut1, pCut);
        //assert( Truth == Ree_ObjComputeTruth(p, iObj, pCut) );
        if ( Truth & 0x80 )
            Truth = 0xFF & ~Truth;
        if ( Truth == 0x66 && iXor2 == -1 )
            iXor2 = Vec_IntSize(vCuts);
        else if ( Truth == 0x69 && iXor3 == -1 )
            iXor3 = Vec_IntSize(vCuts);
        Vec_IntAddToEntry( vCuts, 0, 1 );  
        for ( c = 0; c <= pCut[0]; c++ )
            Vec_IntPush( vCuts, pCut[c] );
        Vec_IntPush( vCuts, TruthC );
        if ( (Truth == 0x66 || Truth == 0x11 || Truth == 0x22 || Truth == 0x44 || Truth == 0x77) && pCut[0] == 2 )
        {
            assert( pCut[0] == 2 );
            Value = Hsh_Int3ManInsert( pHash, pCut[1], pCut[2], 0 );
            Vec_IntPushThree( vData, iObj, Value, TruthC );
        }
        else if ( Truth == 0x69 || Truth == 0x17 || Truth == 0x2B || Truth == 0x4D || Truth == 0x71 )
        {
            assert( pCut[0] == 3 );
            Value = Hsh_Int3ManInsert( pHash, pCut[1], pCut[2], pCut[3] );
            Vec_IntPushThree( vData, iObj, Value, TruthC );
        }
        if ( fVerbose )
            Ree_ManCutPrint( pCut, ++Count, TruthC, iObj );
    }
    if ( !vXors )
        return;
    if ( iXor2 > 0 )
        pCut0 = Vec_IntEntryP( vCuts, iXor2 );
    else if ( iXor3 > 0 )
        pCut0 = Vec_IntEntryP( vCuts, iXor3 );
    else
        return;
    Vec_IntPush( vXors, iObj );
    for ( c = 1; c <= pCut0[0]; c++ )
        Vec_IntPush( vXors, pCut0[c] );
    if ( pCut0[0] == 2 )
        Vec_IntPush( vXors, 0 );
}